

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O0

void If_ObjPerformMappingChoice(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess)

{
  short sVar1;
  If_Set_t *pCutSet_00;
  int iVar2;
  If_Cut_t *pIVar3;
  bool bVar4;
  float local_68;
  float local_64;
  float local_60;
  bool local_49;
  int local_44;
  int fSave0;
  int i;
  If_Cut_t *pCut;
  If_Cut_t *pCutTemp;
  If_Obj_t *pTemp;
  If_Set_t *pCutSet;
  int fPreprocess_local;
  int Mode_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  local_49 = true;
  if ((((p->pPars->fDelayOpt == 0) && (local_49 = true, p->pPars->fDelayOptLut == 0)) &&
      (local_49 = true, p->pPars->fDsdBalance == 0)) &&
     (local_49 = true, p->pPars->fUserRecLib == 0)) {
    local_49 = p->pPars->fUse34Spec != 0;
  }
  if (pObj->pEquiv == (If_Obj_t *)0x0) {
    __assert_fail("pObj->pEquiv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                  ,0x1a9,"void If_ObjPerformMappingChoice(If_Man_t *, If_Obj_t *, int, int)");
  }
  pCutTemp = (If_Cut_t *)pObj;
  if ((Mode != 0) && (0 < pObj->nRefs)) {
    pIVar3 = If_ObjCutBest(pObj);
    If_CutAreaDeref(p,pIVar3);
  }
  for (; pCutTemp != (If_Cut_t *)0x0; pCutTemp = *(If_Cut_t **)&pCutTemp[1].Power) {
    *(short *)(*(long *)&pCutTemp[2].Power + 2) = *(short *)(*(long *)&pCutTemp[2].Power + 2) + -1;
  }
  pCutSet_00 = pObj->pCutSet;
  pCutTemp = (If_Cut_t *)pObj->pEquiv;
  do {
    if (pCutTemp == (If_Cut_t *)0x0) {
      if (pCutSet_00->nCuts < 1) {
        __assert_fail("pCutSet->nCuts > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                      ,0x1d9,"void If_ObjPerformMappingChoice(If_Man_t *, If_Obj_t *, int, int)");
      }
      if ((fPreprocess == 0) || ((*pCutSet_00->ppCuts)->Delay <= pObj->Required + p->fEpsilon)) {
        pIVar3 = If_ObjCutBest(pObj);
        If_CutCopy(p,pIVar3,*pCutSet_00->ppCuts);
      }
      if (((*(uint *)pObj >> 0xc & 1) == 0) &&
         (pIVar3 = If_ObjCutBest(pObj), 1 < *(uint *)&pIVar3->field_0x1c >> 0x18)) {
        sVar1 = pCutSet_00->nCuts;
        pCutSet_00->nCuts = sVar1 + 1;
        If_ManSetupCutTriv(p,pCutSet_00->ppCuts[sVar1],pObj->Id);
        if (pCutSet_00->nCutsMax + 1 < (int)pCutSet_00->nCuts) {
          __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                        ,0x1e2,"void If_ObjPerformMappingChoice(If_Man_t *, If_Obj_t *, int, int)");
        }
      }
      if ((Mode != 0) && (0 < pObj->nRefs)) {
        pIVar3 = If_ObjCutBest(pObj);
        If_CutAreaRef(p,pIVar3);
      }
      If_ManDerefChoiceCutSet(p,pObj);
      return;
    }
    if (*(short *)(*(long *)&pCutTemp[2].Power + 2) != 0) {
      local_44 = 0;
      while( true ) {
        bVar4 = false;
        if (local_44 < *(short *)(*(long *)&pCutTemp[2].Power + 2)) {
          pCut = *(If_Cut_t **)(*(long *)(*(long *)&pCutTemp[2].Power + 0x10) + (long)local_44 * 8);
          bVar4 = pCut != (If_Cut_t *)0x0;
        }
        if (!bVar4) break;
        if ((*(uint *)&pCut->field_0x1c >> 0xe & 1) == 0) {
          if (pCutSet_00->nCutsMax < pCutSet_00->nCuts) {
            __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                          ,0x1c1,"void If_ObjPerformMappingChoice(If_Man_t *, If_Obj_t *, int, int)"
                         );
          }
          pIVar3 = pCutSet_00->ppCuts[pCutSet_00->nCuts];
          If_CutCopy(p,pIVar3,pCut);
          iVar2 = If_CutFilter(pCutSet_00,pIVar3,(uint)local_49);
          if ((iVar2 == 0) && ((Mode == 0 || (pIVar3->Delay <= pObj->Required + p->fEpsilon)))) {
            *(uint *)&pIVar3->field_0x1c =
                 *(uint *)&pIVar3->field_0x1c & 0xffffefff |
                 (*(uint *)pObj >> 6 & 1 ^ (uint)pCutTemp->Area >> 6 & 1) << 0xc;
            if (Mode == 2) {
              local_60 = If_CutAreaDerefed(p,pIVar3);
            }
            else {
              local_60 = If_CutAreaFlow(p,pIVar3);
            }
            pIVar3->Area = local_60;
            if (p->pPars->fEdge != 0) {
              if (Mode == 2) {
                local_64 = If_CutEdgeDerefed(p,pIVar3);
              }
              else {
                local_64 = If_CutEdgeFlow(p,pIVar3);
              }
              pIVar3->Edge = local_64;
            }
            if (p->pPars->fPower != 0) {
              if (Mode == 2) {
                local_68 = If_CutPowerDerefed(p,pIVar3,pObj);
              }
              else {
                local_68 = If_CutPowerFlow(p,pIVar3,pObj);
              }
              pIVar3->Power = local_68;
            }
            If_CutSort(p,pCutSet_00,pIVar3);
          }
        }
        local_44 = local_44 + 1;
      }
    }
    pCutTemp = *(If_Cut_t **)&pCutTemp[1].Power;
  } while( true );
}

Assistant:

void If_ObjPerformMappingChoice( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess )
{
    If_Set_t * pCutSet;
    If_Obj_t * pTemp;
    If_Cut_t * pCutTemp, * pCut;
    int i, fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUse34Spec;
    assert( pObj->pEquiv != NULL );

    // prepare
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // remove elementary cuts
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
        pTemp->pCutSet->nCuts--;

    // update the cutset of the node
    pCutSet = pObj->pCutSet;

    // generate cuts
    for ( pTemp = pObj->pEquiv; pTemp; pTemp = pTemp->pEquiv )
    {
        if ( pTemp->pCutSet->nCuts == 0 )
            continue;
        // go through the cuts of this node
        If_ObjForEachCut( pTemp, pCutTemp, i )
        {
            if ( pCutTemp->fUseless )
                continue;
            // get the next free cut
            assert( pCutSet->nCuts <= pCutSet->nCutsMax );
            pCut = pCutSet->ppCuts[pCutSet->nCuts];
            // copy the cut into storage
            If_CutCopy( p, pCut, pCutTemp );
            // check if this cut is contained in any of the available cuts
            if ( If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            // check if the cut satisfies the required times
//            assert( pCut->Delay == If_CutDelay( p, pTemp, pCut ) );
            if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
                continue;
            // set the phase attribute
            pCut->fCompl = pObj->fPhase ^ pTemp->fPhase;
            // compute area of the cut (this area may depend on the application specific cost)
            pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
            if ( p->pPars->fEdge )
                pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
            if ( p->pPars->fPower )
                pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//            pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
            // insert the cut into storage
            If_CutSort( p, pCutSet, pCut );
        }
    } 
    assert( pCutSet->nCuts > 0 );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    // free the cuts
    If_ManDerefChoiceCutSet( p, pObj );
}